

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O0

int Gia_QbfSolve(Gia_Man_t *pGia,int nPars,int nIterLimit,int nConfLimit,int nTimeOut,int nEncVars,
                int fGlucose,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Qbf_Man_t *p_00;
  char *pcVar6;
  Gia_Man_t *pCof_00;
  abctime aVar7;
  abctime aVar8;
  long lVar9;
  int local_6c;
  int nBits;
  int nZeros;
  abctime clk;
  int local_40;
  int RetValue;
  int status;
  int i;
  Gia_Man_t *pCof;
  Qbf_Man_t *p;
  int nEncVars_local;
  int nTimeOut_local;
  int nConfLimit_local;
  int nIterLimit_local;
  int nPars_local;
  Gia_Man_t *pGia_local;
  
  p_00 = Gia_QbfAlloc(pGia,nPars,fGlucose,fVerbose);
  clk._4_4_ = 0;
  if (fVerbose != 0) {
    pcVar6 = Gia_ManName(pGia);
    uVar4 = p_00->nPars;
    uVar1 = p_00->nVars;
    uVar2 = Gia_ManAndNum(pGia);
    printf("Solving QBF for \"%s\" with %d parameters, %d variables and %d AIG nodes.\n",pcVar6,
           (ulong)uVar4,(ulong)uVar1,(ulong)uVar2);
  }
  iVar3 = Gia_ManRegNum(pGia);
  if (iVar3 != 0) {
    __assert_fail("Gia_ManRegNum(pGia) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                  ,0x34a,"int Gia_QbfSolve(Gia_Man_t *, int, int, int, int, int, int, int)");
  }
  Vec_IntFill(p_00->vValues,nPars,0);
  RetValue = 0;
  while (iVar3 = Gia_QbfVerify(p_00,p_00->vValues), iVar3 != 0) {
    iVar3 = Vec_IntSize(p_00->vValues);
    if (iVar3 != p_00->nVars) {
      __assert_fail("Vec_IntSize(p->vValues) == p->nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                    ,0x34f,"int Gia_QbfSolve(Gia_Man_t *, int, int, int, int, int, int, int)");
    }
    pCof_00 = Gia_QbfCofactor(pGia,nPars,p_00->vValues,p_00->vParMap);
    if (p_00->pSatSynG == (bmcg_sat_solver *)0x0) {
      local_6c = Gia_QbfAddCofactor(p_00,pCof_00);
    }
    else {
      local_6c = Gia_QbfAddCofactorG(p_00,pCof_00);
    }
    Gia_ManStop(pCof_00);
    if (local_6c == 0) {
      clk._4_4_ = 1;
      break;
    }
    aVar8 = Abc_Clock();
    if (p_00->pSatSynG == (bmcg_sat_solver *)0x0) {
      local_40 = sat_solver_solve(p_00->pSatSyn,(lit *)0x0,(lit *)0x0,(long)nConfLimit,0,0,0);
    }
    else {
      local_40 = bmcg_sat_solver_solve(p_00->pSatSynG,(int *)0x0,0);
    }
    aVar7 = Abc_Clock();
    p_00->clkSat = (aVar7 - aVar8) + p_00->clkSat;
    if (fVerbose != 0) {
      Gia_QbfPrint(p_00,p_00->vValues,RetValue);
    }
    if (local_40 == -1) {
      clk._4_4_ = 1;
      break;
    }
    if (local_40 == 0) {
      clk._4_4_ = -1;
      break;
    }
    Gia_QbfOnePattern(p_00,p_00->vValues);
    iVar3 = Vec_IntSize(p_00->vValues);
    if (iVar3 != p_00->nPars) {
      __assert_fail("Vec_IntSize(p->vValues) == p->nPars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                    ,0x361,"int Gia_QbfSolve(Gia_Man_t *, int, int, int, int, int, int, int)");
    }
    if ((nIterLimit != 0) && (RetValue + 1 == nIterLimit)) {
      clk._4_4_ = -1;
      break;
    }
    if ((nTimeOut != 0) &&
       (aVar8 = Abc_Clock(), (long)nTimeOut <= (aVar8 - p_00->clkStart) / 1000000)) {
      clk._4_4_ = -1;
      break;
    }
    RetValue = RetValue + 1;
  }
  if (clk._4_4_ == 0) {
    uVar4 = Vec_IntCountZero(p_00->vValues);
    printf("Parameters: ");
    iVar3 = Vec_IntSize(p_00->vValues);
    if (iVar3 != nPars) {
      __assert_fail("Vec_IntSize(p->vValues) == nPars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                    ,0x36c,"int Gia_QbfSolve(Gia_Man_t *, int, int, int, int, int, int, int)");
    }
    Vec_IntPrintBinary(p_00->vValues);
    iVar3 = Vec_IntSize(p_00->vValues);
    printf("  Statistics: 0=%d 1=%d\n",(ulong)uVar4,(ulong)(iVar3 - uVar4));
    if (nEncVars != 0) {
      iVar3 = Vec_IntSize(p_00->vValues);
      iVar3 = iVar3 / (1 << ((byte)nEncVars & 0x1f));
      iVar5 = Vec_IntSize(p_00->vValues);
      if (iVar5 != (1 << ((byte)nEncVars & 0x1f)) * iVar3) {
        __assert_fail("Vec_IntSize(p->vValues) == (1 << nEncVars) * nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                      ,0x372,"int Gia_QbfSolve(Gia_Man_t *, int, int, int, int, int, int, int)");
      }
      Gia_Gen2CodePrint(nEncVars,iVar3,p_00->vValues);
    }
  }
  if ((clk._4_4_ == -1) && (nTimeOut != 0)) {
    aVar8 = Abc_Clock();
    lVar9 = aVar8 - p_00->clkStart;
    if ((long)nTimeOut <= lVar9 / 1000000) {
      printf("The problem timed out after %d sec.  ",(ulong)(uint)nTimeOut,lVar9 % 1000000);
      goto LAB_009cfd69;
    }
  }
  if ((clk._4_4_ == -1) && (nConfLimit != 0)) {
    printf("The problem aborted after %d conflicts.  ",(ulong)(uint)nConfLimit);
  }
  else if ((clk._4_4_ == -1) && (nIterLimit != 0)) {
    printf("The problem aborted after %d iterations.  ",(ulong)(uint)nIterLimit);
  }
  else if (clk._4_4_ == 1) {
    printf("The problem is UNSAT after %d iterations.  ",(ulong)(uint)RetValue);
  }
  else {
    printf("The problem is SAT after %d iterations.  ",(ulong)(uint)RetValue);
  }
LAB_009cfd69:
  if (fVerbose == 0) {
    aVar8 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar8 - p_00->clkStart);
  }
  else {
    printf("\n");
    Abc_PrintTime(1,"SAT  ",p_00->clkSat);
    aVar8 = Abc_Clock();
    Abc_PrintTime(1,"Other",(aVar8 - p_00->clkStart) - p_00->clkSat);
    aVar8 = Abc_Clock();
    Abc_PrintTime(1,"TOTAL",aVar8 - p_00->clkStart);
  }
  Gia_QbfFree(p_00);
  return clk._4_4_;
}

Assistant:

int Gia_QbfSolve( Gia_Man_t * pGia, int nPars, int nIterLimit, int nConfLimit, int nTimeOut, int nEncVars, int fGlucose, int fVerbose )
{
    Qbf_Man_t * p = Gia_QbfAlloc( pGia, nPars, fGlucose, fVerbose );
    Gia_Man_t * pCof;
    int i, status, RetValue = 0;
    abctime clk;
//    Gia_QbfAddSpecialConstr( p );
    if ( fVerbose )
        printf( "Solving QBF for \"%s\" with %d parameters, %d variables and %d AIG nodes.\n", 
            Gia_ManName(pGia), p->nPars, p->nVars, Gia_ManAndNum(pGia) );
    assert( Gia_ManRegNum(pGia) == 0 );
    Vec_IntFill( p->vValues, nPars, 0 );
    for ( i = 0; Gia_QbfVerify(p, p->vValues); i++ )
    {
        // generate next constraint
        assert( Vec_IntSize(p->vValues) == p->nVars );
        pCof = Gia_QbfCofactor( pGia, nPars, p->vValues, p->vParMap );
        status = p->pSatSynG ? Gia_QbfAddCofactorG( p, pCof ) : Gia_QbfAddCofactor( p, pCof );
        Gia_ManStop( pCof );
        if ( status == 0 )       { RetValue =  1; break; }
        // synthesize next assignment
        clk = Abc_Clock();
        if ( p->pSatSynG )
            status = bmcg_sat_solver_solve( p->pSatSynG, NULL, 0 );
        else
            status = sat_solver_solve( p->pSatSyn, NULL, NULL, (ABC_INT64_T)nConfLimit, 0, 0, 0 );
        p->clkSat += Abc_Clock() - clk;
        if ( fVerbose )
            Gia_QbfPrint( p, p->vValues, i );
        if ( status == l_False ) { RetValue =  1; break; }
        if ( status == l_Undef ) { RetValue = -1; break; }
        // extract SAT assignment
        Gia_QbfOnePattern( p, p->vValues );
        assert( Vec_IntSize(p->vValues) == p->nPars );
        // examine variables
//        Gia_QbfLearnConstraint( p, p->vValues );
//        Vec_IntPrintBinary( p->vValues ); printf( "\n" );
        if ( nIterLimit && i+1 == nIterLimit ) { RetValue = -1; break; }
        if ( nTimeOut && (Abc_Clock() - p->clkStart)/CLOCKS_PER_SEC >= nTimeOut ) { RetValue = -1; break; }
    }
    if ( RetValue == 0 )
    {
        int nZeros = Vec_IntCountZero( p->vValues );
        printf( "Parameters: " );
        assert( Vec_IntSize(p->vValues) == nPars );
        Vec_IntPrintBinary( p->vValues );
        printf( "  Statistics: 0=%d 1=%d\n", nZeros, Vec_IntSize(p->vValues) - nZeros );
        if ( nEncVars )
        {
            int nBits = Vec_IntSize(p->vValues)/(1 << nEncVars);
            assert( Vec_IntSize(p->vValues) == (1 << nEncVars) * nBits );
            Gia_Gen2CodePrint( nEncVars, nBits, p->vValues );
        }
    }
    if ( RetValue == -1 && nTimeOut && (Abc_Clock() - p->clkStart)/CLOCKS_PER_SEC >= nTimeOut )
        printf( "The problem timed out after %d sec.  ", nTimeOut );
    else if ( RetValue == -1 && nConfLimit )
        printf( "The problem aborted after %d conflicts.  ", nConfLimit );
    else if ( RetValue == -1 && nIterLimit )
        printf( "The problem aborted after %d iterations.  ", nIterLimit );
    else if ( RetValue == 1 )
        printf( "The problem is UNSAT after %d iterations.  ", i );
    else 
        printf( "The problem is SAT after %d iterations.  ", i );
    if ( fVerbose )
    {
        printf( "\n" );
        Abc_PrintTime( 1, "SAT  ", p->clkSat );
        Abc_PrintTime( 1, "Other", Abc_Clock() - p->clkStart - p->clkSat );
        Abc_PrintTime( 1, "TOTAL", Abc_Clock() - p->clkStart );
    }
    else
        Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    Gia_QbfFree( p );
    return RetValue;
}